

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O0

void print_IOConversion_as_XML(IOConversionPtr conv_ptr,int indent)

{
  long lVar1;
  undefined8 *puVar2;
  char *pcVar3;
  int in_ESI;
  undefined4 *in_RDI;
  int size;
  int offset;
  FMFormat_conflict f;
  int field;
  int j;
  FMVarInfoStruct *iovar;
  FMFieldPtr src_field;
  int ind;
  int i;
  int local_2c;
  int iVar4;
  int iVar5;
  
  if (in_ESI == 0) {
    for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
      printf("    ");
    }
    printf("<IOConversion baseType=\"");
    if (in_RDI == (undefined4 *)0x0) {
      printf("NULL\" />");
      return;
    }
    switch(*in_RDI) {
    case 0:
      printf("None_Required");
      break;
    case 1:
      printf("Direct_to_Memory");
      break;
    case 2:
      printf("Buffer_and_Convert");
      break;
    case 3:
      printf("Copy_Strings");
    }
    printf("\">\n");
  }
  for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
    printf("    ");
  }
  printf("<baseSizeDelta>%zd</baseSizeDelta>\n",*(undefined8 *)(in_RDI + 6));
  printf("<maxVarExpansion>%g</maxVarExpansion>\n",*(undefined8 *)(in_RDI + 8));
  printf("<targetPointerSize>%d</targetPointerSize>\n",(ulong)(uint)in_RDI[10]);
  printf("<stringOffsetSize>%zd</stringOffsetSize>\n",*(undefined8 *)(in_RDI + 0x20));
  printf("<convertedStrings>%d</convertedStrings>\n",(ulong)(uint)in_RDI[0x22]);
  for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
    printf("    ");
  }
  for (iVar4 = 0; iVar4 < (int)in_RDI[4]; iVar4 = iVar4 + 1) {
    puVar2 = (undefined8 *)(in_RDI + (long)iVar4 * 0x12 + 0x24);
    lVar1 = *(long *)(in_RDI + (long)iVar4 * 0x12 + 0x2a);
    for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
      printf("    ");
    }
    printf("<registeredConversion>\n");
    for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
      printf("    ");
    }
    pcVar3 = data_type_to_str(*(FMdata_type *)((long)puVar2 + 0xc));
    printf("<baseType>%s</baseType>\n",pcVar3);
    printf("<controlField>\n");
    if (*(long *)(in_RDI + (long)iVar4 * 0x12 + 0x2a) != 0) {
      for (local_2c = 0; local_2c < *(int *)(lVar1 + 0x10); local_2c = local_2c + 1) {
        if (*(int *)(*(long *)(lVar1 + 0x18) + (long)local_2c * 8) == 0) {
          iVar5 = *(int *)(*(long *)(lVar1 + 0x18) + 4 + (long)local_2c * 8);
          printf("<offset>%d</offset><size units=\"bytes\">%d</size>\n",
                 (ulong)*(uint *)(*(long *)(*(long *)(*(long *)(in_RDI + 0xe) + 0x38) + 0x78) +
                                  (long)iVar5 * 0x18 + 0x14),
                 (ulong)*(uint *)(*(long *)(*(long *)(*(long *)(in_RDI + 0xe) + 0x38) + 0x78) +
                                  (long)iVar5 * 0x18 + 0x10));
        }
        else {
          printf("<arrayDimension>%d</arrayDimension>",
                 (ulong)*(uint *)(*(long *)(lVar1 + 0x18) + (long)local_2c * 8));
        }
      }
    }
    printf("</controlField>\n");
    if (*(char *)(puVar2 + 2) == '\0') {
      printf("\n");
    }
    else {
      printf("<byteReversal />\n");
    }
    for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
      printf("    ");
    }
    printf("<sourceOffset>%zd</sourceOffset><sourceSize>%d</sourceSize>\n",*puVar2,
           (ulong)*(uint *)(puVar2 + 1));
    for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
      printf("    ");
    }
    printf("<destOffset>%zd</destOffset><destSize>%d</destSize>\n",
           *(undefined8 *)(in_RDI + (long)iVar4 * 0x12 + 0x2c),
           (ulong)(uint)in_RDI[(long)iVar4 * 0x12 + 0x2e]);
    if (*(long *)(in_RDI + (long)iVar4 * 0x12 + 0x34) != 0) {
      for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
        printf("    ");
      }
      if (*(undefined4 **)(in_RDI + (long)iVar4 * 0x12 + 0x34) == in_RDI) {
        printf("    Subconversion is recursive\n");
      }
      else {
        print_IOConversion_as_XML((IOConversionPtr)CONCAT44(in_ESI,iVar4),iVar5);
      }
    }
  }
  printf("</IOConversion>\n");
  return;
}

Assistant:

static void
print_IOConversion_as_XML(IOConversionPtr conv_ptr, int indent)
{
    int i;
    int ind;
    if (indent == 0) {
	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<IOConversion baseType=\"");
	if (conv_ptr == NULL) {
	    printf("NULL\" />");
	    return;
	}
	switch (conv_ptr->conversion_type) {
	case none_required:
	    printf("None_Required");
	    break;
	case direct_to_mem:
	    printf("Direct_to_Memory");
	    break;
	case buffer_and_convert:
	    printf("Buffer_and_Convert");
	    break;
	case copy_dynamic_portion:
	    printf("Copy_Strings");
	    break;
	default:
	    assert(FALSE);
	    break;
	}
	printf("\">\n");
    }
    for (ind = 0; ind < indent; ind++)
	printf("    ");
    printf("<baseSizeDelta>%zd</baseSizeDelta>\n", conv_ptr->base_size_delta);
    printf("<maxVarExpansion>%g</maxVarExpansion>\n", conv_ptr->max_var_expansion);
    printf("<targetPointerSize>%d</targetPointerSize>\n", conv_ptr->target_pointer_size);
    printf("<stringOffsetSize>%zd</stringOffsetSize>\n", conv_ptr->string_offset_size);
    printf("<convertedStrings>%d</convertedStrings>\n", conv_ptr->converted_strings);
    for (ind = 0; ind < indent; ind++)
	printf("    ");
    for (i = 0; i < conv_ptr->conv_count; i++) {
	FMFieldPtr src_field = &conv_ptr->conversions[i].src_field;
	FMVarInfoStruct *iovar = conv_ptr->conversions[i].iovar;

	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<registeredConversion>\n");
	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<baseType>%s</baseType>\n",
	 data_type_to_str(src_field->data_type));
	printf("<controlField>\n");
	if (conv_ptr->conversions[i].iovar != NULL) {
	    int j;
	    for (j = 0; j < iovar->dimen_count; j++) {
		if (iovar->dimens[j].static_size != 0) {
		    printf("<arrayDimension>%d</arrayDimension>", 
			   iovar->dimens[j].static_size);
		} else {
		    int field = iovar->dimens[j].control_field_index;
		    FMFormat f = conv_ptr->ioformat->body;
		    int offset = f->field_list[field].field_offset;
		    int size = f->field_list[field].field_size;
		    /* variant array */
		    printf("<offset>%d</offset><size units=\"bytes\">%d</size>\n",
			   offset, size);
		}
	    }
	}
	printf("</controlField>\n");
	if (src_field->byte_swap) {
	    printf("<byteReversal />\n");
	} else {
	    printf("\n");
	}
	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<sourceOffset>%zd</sourceOffset><sourceSize>%d</sourceSize>\n",
	       src_field->offset,
	       src_field->size);
	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<destOffset>%zd</destOffset><destSize>%d</destSize>\n",
	       conv_ptr->conversions[i].dest_offset,
	       conv_ptr->conversions[i].dest_size);
	if (conv_ptr->conversions[i].subconversion) {
	    for (ind = 0; ind < indent; ind++)
		printf("    ");
	    if (conv_ptr->conversions[i].subconversion == conv_ptr) {
		printf("    Subconversion is recursive\n");
	    } else {
		print_IOConversion_as_XML(conv_ptr->conversions[i].subconversion,
					  indent + 1);
	    }
	}
    }
    printf("</IOConversion>\n");
}